

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

void __thiscall
t_js_generator::generate_js_struct_writer(t_js_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  t_field *tfield;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  t_js_generator *this_00;
  pointer pptVar6;
  string name;
  string local_b8;
  t_struct *local_98;
  char *local_90;
  long local_88;
  char local_80 [16];
  string local_70;
  string local_50;
  
  local_98 = tstruct;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_90 = local_80;
  lVar3 = *(long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,lVar3,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar3);
  if (this->gen_es6_ == true) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"write (output) {",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,out);
    js_namespace_abi_cxx11_(&local_b8,this,(local_98->super_t_type).program_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    iVar4 = (*(local_98->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_00,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,".prototype.write = function(output) {",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"output.writeStructBegin(\'",0x19);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\');",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar6 = (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (this.",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                          ((*pptVar6)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," !== null && this.",0x12);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                          ((*pptVar6)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," !== undefined) {",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"output.writeFieldBegin(",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                          ((*pptVar6)->name_)._M_string_length);
      this_00 = (t_js_generator *)0x3879cf;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', ",3);
      type_to_enum_abi_cxx11_(&local_b8,this_00,(*pptVar6)->type_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar6)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      tfield = *pptVar6;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"this.","");
      generate_serialize_field(this,out,tfield,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"output.writeFieldEnd();",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"output.writeFieldStop();",0x18);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"output.writeStructEnd();",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return;",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  if (this->gen_es6_ == true) {
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"};",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void t_js_generator::generate_js_struct_writer(ostream& out, t_struct* tstruct) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_es6_) {
    indent(out) << "write (output) {" << endl;
  } else {
    indent(out) << js_namespace(tstruct->get_program()) << tstruct->get_name()
        << ".prototype.write = function(output) {" << endl;
  }

  indent_up();

  indent(out) << "output.writeStructBegin('" << name << "');" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    out << indent() << "if (this." << (*f_iter)->get_name() << " !== null && this."
        << (*f_iter)->get_name() << " !== undefined) {" << endl;
    indent_up();

    indent(out) << "output.writeFieldBegin("
                << "'" << (*f_iter)->get_name() << "', " << type_to_enum((*f_iter)->get_type())
                << ", " << (*f_iter)->get_key() << ");" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    indent(out) << "output.writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}" << endl;
  }

  out << indent() << "output.writeFieldStop();" << endl << indent() << "output.writeStructEnd();"
      << endl;

  out << indent() << "return;" << endl;

  indent_down();
  if (gen_es6_) {
    out << indent() << "}" << endl << endl;
  } else {
    out << indent() << "};" << endl << endl;
  }
}